

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O0

HT_Boolean
ht_tcp_server_start(HT_TCPServer *server,int port,OnClientConnected client_connected_cb,
                   void *user_data)

{
  HT_Boolean HVar1;
  int iVar2;
  HT_Thread *pHVar3;
  undefined1 local_44 [8];
  sockaddr_in serveraddr;
  int optval;
  void *user_data_local;
  OnClientConnected client_connected_cb_local;
  int port_local;
  HT_TCPServer *server_local;
  
  unique0x1000018a = user_data;
  HVar1 = ht_tcp_server_is_running(server);
  if (HVar1 != 0) {
    ht_tcp_server_stop(server);
  }
  iVar2 = socket(2,1,0);
  server->server_sock_fd = iVar2;
  if (server->server_sock_fd < 0) {
    server_local._4_4_ = 0;
  }
  else {
    serveraddr.sin_zero[0] = '\x01';
    serveraddr.sin_zero[1] = '\0';
    serveraddr.sin_zero[2] = '\0';
    serveraddr.sin_zero[3] = '\0';
    iVar2 = setsockopt(server->server_sock_fd,1,2,serveraddr.sin_zero,4);
    if (iVar2 == 0) {
      memset(local_44,0,0x10);
      local_44._0_2_ = 2;
      local_44._4_4_ = htonl(0);
      local_44._2_2_ = htons((uint16_t)port);
      iVar2 = bind(server->server_sock_fd,(sockaddr *)local_44,0x10);
      if (iVar2 < 0) {
        ht_tcp_server_stop(server);
        server_local._4_4_ = 0;
      }
      else {
        iVar2 = listen(server->server_sock_fd,5);
        if (iVar2 < 0) {
          ht_tcp_server_stop(server);
          server_local._4_4_ = 0;
        }
        else {
          server->client_connected_cb = client_connected_cb;
          server->client_connected_ud = stack0xffffffffffffffd0;
          pHVar3 = ht_thread_create(_ht_tcp_server_run,server);
          server->accept_client_thread = pHVar3;
          server_local._4_4_ = 1;
        }
      }
    }
    else {
      ht_tcp_server_stop(server);
      server_local._4_4_ = 0;
    }
  }
  return server_local._4_4_;
}

Assistant:

HT_Boolean
ht_tcp_server_start(HT_TCPServer* server, int port, OnClientConnected client_connected_cb, void* user_data)
{
    if (ht_tcp_server_is_running(server))
    {
        ht_tcp_server_stop(server);
    }
#ifdef _WIN32
    WSADATA wsaData;
    if (WSAStartup(MAKEWORD(2, 2), &wsaData) != 0)
    {
        return HT_FALSE;
    }
#endif
    server->server_sock_fd = socket(AF_INET, SOCK_STREAM, 0);

    if (server->server_sock_fd < 0)
    {
        return HT_FALSE;
    }

#ifndef _WIN32
    int optval = 1;
    if (setsockopt(server->server_sock_fd, SOL_SOCKET, SO_REUSEADDR, (const void *)&optval , sizeof(int)) != 0)
    {
        ht_tcp_server_stop(server);
        return HT_FALSE;
    }
#endif

    struct sockaddr_in serveraddr;
    memset((char *) &serveraddr, 0, sizeof(serveraddr));
    serveraddr.sin_family = AF_INET;
    serveraddr.sin_addr.s_addr = htonl(INADDR_ANY);
    serveraddr.sin_port = htons((unsigned short)port);

    if (bind(server->server_sock_fd, (struct sockaddr *) &serveraddr, sizeof(serveraddr)) < 0)
    {
        ht_tcp_server_stop(server);
        return HT_FALSE;
    }

    if (listen(server->server_sock_fd, 5) < 0)
    {
        ht_tcp_server_stop(server);
        return HT_FALSE;
    }

    server->client_connected_cb = client_connected_cb;
    server->client_connected_ud = user_data;
    server->accept_client_thread = ht_thread_create(_ht_tcp_server_run, server);

    return HT_TRUE;
}